

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

void __thiscall
pybind11::detail::
list_caster<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::pair<long,_long>_>
::list_caster(list_caster<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::pair<long,_long>_>
              *this)

{
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x390cee);
  return;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }